

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperH.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CShArchitecture::parseOpcode(CShArchitecture *this,Parser *parser)

{
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  ShParser shParser;
  Parser *parser_local;
  CShArchitecture *this_local;
  
  ShParser::ShParser((ShParser *)local_c8);
  ShParser::parseOpcode((ShParser *)local_d0,(Parser *)local_c8);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<CShInstruction,std::default_delete<CShInstruction>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
             (unique_ptr<CShInstruction,_std::default_delete<CShInstruction>_> *)local_d0);
  std::unique_ptr<CShInstruction,_std::default_delete<CShInstruction>_>::~unique_ptr
            ((unique_ptr<CShInstruction,_std::default_delete<CShInstruction>_> *)local_d0);
  ShParser::~ShParser((ShParser *)local_c8);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CShArchitecture::parseOpcode(Parser& parser)
{
	ShParser shParser;
	return shParser.parseOpcode(parser);
}